

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

GroupInfo __thiscall UnifiedRegex::RegexPattern::GetGroup(RegexPattern *this,int groupId)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  undefined4 *puVar4;
  Matcher *this_00;
  GroupInfo GVar5;
  int groupId_local;
  RegexPattern *this_local;
  
  if (groupId != 0) {
    bVar2 = WasLastMatchSuccessful(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                         ,0x80,"(groupId == 0 || WasLastMatchSuccessful())",
                         "groupId == 0 || WasLastMatchSuccessful()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  if (-1 < groupId) {
    uVar3 = NumGroups(this);
    if (groupId < (int)(uint)uVar3) goto LAB_015bc346;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                     ,0x81,"(groupId >= 0 && groupId < NumGroups())",
                     "groupId >= 0 && groupId < NumGroups()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_015bc346:
  this_00 = Memory::WriteBarrierPtr<UnifiedRegex::Matcher>::operator->(&(this->rep).unified.matcher)
  ;
  GVar5 = Matcher::GetGroup(this_00,groupId);
  return GVar5;
}

Assistant:

GroupInfo RegexPattern::GetGroup(int groupId) const
    {
        Assert(groupId == 0 || WasLastMatchSuccessful());
        Assert(groupId >= 0 && groupId < NumGroups());
        return rep.unified.matcher->GetGroup(groupId);
    }